

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::JunitReporter::EndTestCase
          (JunitReporter *this,TestCaseInfo *param_1,Totals *param_2,string *stdOut,string *stdErr)

{
  ostream *poVar1;
  
  if (stdOut->_M_string_length != 0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->m_stdOut,(stdOut->_M_dataplus)._M_p,
                        stdOut->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  }
  if (stdErr->_M_string_length != 0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->m_stdErr,(stdErr->_M_dataplus)._M_p,
                        stdErr->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    return;
  }
  return;
}

Assistant:

virtual void EndTestCase( const Catch::TestCaseInfo&, const Totals&, const std::string& stdOut, const std::string& stdErr ) {
            if( !stdOut.empty() )
                m_stdOut << stdOut << "\n";
            if( !stdErr.empty() )
                m_stdErr << stdErr << "\n";
        }